

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O2

char * avro::json::typeToString(EntityType t)

{
  if (t < (etObject|etBool)) {
    return &DAT_001c4b24 + *(int *)(&DAT_001c4b24 + (ulong)t * 4);
  }
  return "unknown";
}

Assistant:

static const char* typeToString(EntityType t)
{
    switch (t) {
    case etNull: return "null";
    case etBool: return "bool";
    case etLong: return "long";
    case etDouble: return "double";
    case etString: return "string";
    case etArray: return "array";
    case etObject: return "object";
    default: return "unknown";
    }
}